

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O3

string * getScriptName(string *__return_storage_ptr__,string *script_path)

{
  string local_30;
  
  basename((char *)&local_30);
  dropExtension(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getScriptName (const std::string& script_path)
{
  return dropExtension (basename (script_path));
}